

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TestRunStats_00294940;
  Totals::~Totals((Totals *)0x1381ba);
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x1381c8);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;